

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O3

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ulong __n;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char cVar11;
  bool bVar12;
  uchar address_1 [16];
  uint address;
  char hostip [128];
  uint local_168 [4];
  uint local_158 [6];
  char *local_140;
  char local_138 [128];
  char local_b8 [136];
  
  if (no_proxy == (char *)0x0) {
    return false;
  }
  bVar1 = *no_proxy;
  if (bVar1 == 0) {
    return false;
  }
  if (bVar1 == 0x2a) {
    iVar3 = -(uint)(byte)no_proxy[1];
  }
  else {
    iVar3 = 0x2a - (uint)bVar1;
  }
  if (iVar3 == 0) {
    return true;
  }
  if (*name == '[') {
    pcVar6 = strchr(name,0x5d);
    if (pcVar6 == (char *)0x0) {
      return false;
    }
    pcVar10 = name + 1;
    __n = (long)pcVar6 - (long)pcVar10;
    if (0x7f < __n) {
      return false;
    }
    name = local_b8;
    memcpy(name,pcVar10,__n);
    local_b8[__n] = '\0';
    cVar11 = '\x02';
  }
  else {
    iVar3 = inet_pton(2,name,local_138);
    cVar11 = iVar3 == 1;
    __n = strlen(name);
    bVar1 = *no_proxy;
    if (bVar1 == 0) {
      return false;
    }
  }
  uVar9 = (ulong)bVar1;
  local_140 = name + __n + 1;
  do {
    while ((cVar7 = (char)uVar9, cVar7 == '\t' || ((int)uVar9 == 0x20))) {
      uVar9 = (ulong)(byte)no_proxy[1];
      no_proxy = no_proxy + 1;
    }
    pcVar6 = no_proxy + -1;
    uVar8 = 0;
    while ((0x2c < (byte)uVar9 || ((0x100100000201U >> (uVar9 & 0x3f) & 1) == 0))) {
      lVar2 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      pcVar6 = pcVar6 + 1;
      uVar9 = (ulong)(byte)no_proxy[lVar2];
    }
    if (uVar8 != 0) {
      if (cVar11 == '\0') {
        if (cVar7 == '.') {
          if (uVar8 - 1 <= __n) {
            no_proxy = no_proxy + 1;
            pcVar10 = local_140 + -uVar8;
LAB_0060683d:
            iVar3 = Curl_strncasecompare(no_proxy,pcVar10,__n);
            if (iVar3 != 0) {
              return true;
            }
          }
        }
        else {
          pcVar10 = name;
          if (__n == uVar8) goto LAB_0060683d;
        }
      }
      else {
        pcVar10 = strchr(no_proxy,0x2f);
        if (pcVar10 < no_proxy + uVar8 && pcVar10 != (char *)0x0) {
          if (uVar8 < 0x80) {
            uVar4 = atoi(pcVar10 + 1);
            memcpy(local_138,no_proxy,uVar8);
            pcVar10[(long)(local_138 + -(long)no_proxy)] = '\0';
            if (cVar11 == '\x02') {
              if (uVar4 == 0) {
                uVar4 = 0x80;
              }
              uVar9 = (ulong)uVar4;
              no_proxy = local_138;
              goto LAB_00606781;
            }
            local_158[0] = 0;
            local_168[0] = 0;
            no_proxy = local_138;
            if (uVar4 < 0x21) goto LAB_00606864;
          }
        }
        else if (cVar11 == '\x02') {
          uVar9 = 0x80;
LAB_00606781:
          iVar3 = inet_pton(10,name,local_158);
          if (iVar3 == 1) {
            iVar3 = inet_pton(10,no_proxy,local_168);
            if (((uint)uVar9 < 0x88) && (iVar3 == 1)) {
              uVar8 = uVar9 >> 3;
              if (((int)uVar8 != 0x10 || (uVar9 & 7) == 0) &&
                 (((uint)uVar9 < 8 || (iVar3 = bcmp(local_158,local_168,uVar8), iVar3 == 0)))) {
                if ((uVar9 & 7) == 0) {
                  return true;
                }
                if ((byte)((*(byte *)((long)local_168 + uVar8) ^ *(byte *)((long)local_158 + uVar8))
                          >> (8 - ((byte)uVar9 & 7) & 0x1f)) != 0) {
                  return true;
                }
              }
            }
          }
        }
        else {
          uVar4 = 0;
LAB_00606864:
          local_158[0] = 0;
          local_168[0] = 0;
          iVar3 = inet_pton(2,name,local_158);
          if ((iVar3 == 1) && (iVar3 = inet_pton(2,no_proxy,local_168), iVar3 == 1)) {
            if ((uVar4 & 0x1f) == 0) {
              bVar12 = local_158[0] == local_168[0];
            }
            else {
              uVar5 = local_168[0] ^ local_158[0];
              bVar12 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18) >> (-(char)uVar4 & 0x1fU) == 0;
            }
            if (bVar12) {
              return true;
            }
          }
        }
      }
    }
    do {
      bVar1 = pcVar6[1];
      uVar9 = (ulong)bVar1;
      pcVar6 = pcVar6 + 1;
    } while (bVar1 == 0x2c);
    no_proxy = pcVar6;
    if (bVar1 == 0) {
      return false;
    }
  } while( true );
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    char hostip[128];
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      namelen = strlen(name);
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          if(*token == '.') {
            ++token;
            --tokenlen;
            /* tailmatch */
            match = (tokenlen <= namelen) &&
              strncasecompare(token, name + (namelen - tokenlen), namelen);
          }
          else
            match = (tokenlen == namelen) &&
              strncasecompare(token, name, namelen);
          break;
        case TYPE_IPV4:
          /* FALLTHROUGH */
        case TYPE_IPV6: {
          const char *check = token;
          char *slash = strchr(check, '/');
          unsigned int bits = 0;
          char checkip[128];
          /* if the slash is part of this token, use it */
          if(slash && (slash < &check[tokenlen])) {
            bits = atoi(slash + 1);
            /* copy the check name to a temp buffer */
            if(tokenlen >= sizeof(checkip))
              break;
            memcpy(checkip, check, tokenlen);
            checkip[ slash - check ] = 0;
            check = checkip;
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}